

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

ForStreamable<Explicit,_std::string> *
lest::make_string<Explicit>
          (ForStreamable<Explicit,_std::string> *__return_storage_ptr__,Explicit *item)

{
  int iVar1;
  ostringstream os;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  iVar1 = item->x;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"Explicit:",9);
  std::ostream::operator<<((ostream *)aoStack_198,iVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( T const & item ) -> ForStreamable<T, std::string>
{
    std::ostringstream os; os << item; return os.str();
}